

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__horizontal_gather_2_channels_with_n_coeffs_mod3
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float *pfVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  pfVar1 = output_buffer + output_sub_size * 2;
  pfVar7 = horizontal_coefficients + 4;
  do {
    lVar9 = (long)(horizontal_contributors->n0 * 2);
    pfVar4 = decode_buffer + lVar9;
    fVar15 = *pfVar4 * *horizontal_coefficients;
    fVar16 = pfVar4[1] * *horizontal_coefficients;
    fVar17 = pfVar4[2] * horizontal_coefficients[1];
    fVar18 = pfVar4[3] * horizontal_coefficients[1];
    fVar11 = horizontal_coefficients[2] * pfVar4[4];
    fVar12 = horizontal_coefficients[2] * pfVar4[5];
    fVar13 = horizontal_coefficients[3] * pfVar4[6];
    fVar14 = horizontal_coefficients[3] * pfVar4[7];
    iVar6 = ((horizontal_contributors->n1 - horizontal_contributors->n0) + -3 >> 2) + 1;
    pfVar4 = decode_buffer + lVar9 + 8;
    pfVar5 = pfVar7;
    do {
      pfVar10 = pfVar5;
      pfVar8 = pfVar4;
      fVar15 = fVar15 + *pfVar8 * *pfVar10;
      fVar16 = fVar16 + pfVar8[1] * *pfVar10;
      fVar17 = fVar17 + pfVar8[2] * pfVar10[1];
      fVar18 = fVar18 + pfVar8[3] * pfVar10[1];
      fVar11 = fVar11 + pfVar10[2] * pfVar8[4];
      fVar12 = fVar12 + pfVar10[2] * pfVar8[5];
      fVar13 = fVar13 + pfVar10[3] * pfVar8[6];
      fVar14 = fVar14 + pfVar10[3] * pfVar8[7];
      iVar6 = iVar6 + -1;
      pfVar4 = pfVar8 + 8;
      pfVar5 = pfVar10 + 4;
    } while (1 < iVar6);
    fVar2 = pfVar10[4];
    fVar3 = pfVar10[6];
    *(ulong *)output_buffer =
         CONCAT44(fVar14 + fVar3 * 0.0 + fVar18 + pfVar8[0xb] * pfVar10[5] +
                  fVar12 + (float)((ulong)*(undefined8 *)(pfVar8 + 0xc) >> 0x20) * fVar3 +
                  fVar16 + pfVar8[9] * fVar2,
                  fVar13 + fVar3 * 0.0 + fVar17 + pfVar8[10] * pfVar10[5] +
                  fVar11 + (float)*(undefined8 *)(pfVar8 + 0xc) * fVar3 + fVar15 + pfVar8[8] * fVar2
                 );
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 2;
    pfVar7 = pfVar7 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod3 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 7 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__3_coeff_remnant( 4 );

    stbir__store_output();
  } while ( output < output_end );
}